

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O0

Client __thiscall
capnp::_::anon_unknown_0::TestRestorer::restore(TestRestorer *this,Reader objectId)

{
  Tag TVar1;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *extraout_RDX_02;
  ClientHook *extraout_RDX_03;
  ClientHook *extraout_RDX_04;
  ClientHook *pCVar2;
  long in_RSI;
  Client CVar3;
  StringPtr reason;
  Own<capnp::_::TestMoreStuffImpl> local_98;
  Own<capnp::_::TestTailCallerImpl> local_88;
  Own<capnp::_::TestTailCalleeImpl> local_78;
  Own<capnp::_::TestPipelineImpl> local_68;
  StringPtr local_58;
  Own<capnp::ClientHook> local_48 [2];
  Own<capnp::_::TestInterfaceImpl> local_28;
  TestRestorer_conflict *this_local;
  
  this_local = (TestRestorer_conflict *)this;
  TVar1 = capnproto_test::capnp::test::TestSturdyRefObjectId::Reader::getTag(&objectId);
  switch(TVar1) {
  case TEST_INTERFACE:
    kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&local_28,*(int **)(in_RSI + 8));
    Capability::Client::Client<capnp::_::TestInterfaceImpl,void>((Client *)this,&local_28);
    kj::Own<capnp::_::TestInterfaceImpl>::~Own(&local_28);
    pCVar2 = extraout_RDX;
    break;
  case TEST_EXTENDS:
    kj::StringPtr::StringPtr(&local_58,"No TestExtends implemented.");
    reason.content.size_ = (size_t)local_58.content.ptr;
    reason.content.ptr = (char *)local_48;
    newBrokenCap(reason);
    Capability::Client::Client((Client *)this,local_48);
    kj::Own<capnp::ClientHook>::~Own(local_48);
    pCVar2 = extraout_RDX_00;
    break;
  case TEST_PIPELINE:
    kj::heap<capnp::_::TestPipelineImpl,int&>((kj *)&local_68,*(int **)(in_RSI + 8));
    Capability::Client::Client<capnp::_::TestPipelineImpl,void>((Client *)this,&local_68);
    kj::Own<capnp::_::TestPipelineImpl>::~Own(&local_68);
    pCVar2 = extraout_RDX_01;
    break;
  case TEST_TAIL_CALLEE:
    kj::heap<capnp::_::TestTailCalleeImpl,int&>((kj *)&local_78,*(int **)(in_RSI + 8));
    Capability::Client::Client<capnp::_::TestTailCalleeImpl,void>((Client *)this,&local_78);
    kj::Own<capnp::_::TestTailCalleeImpl>::~Own(&local_78);
    pCVar2 = extraout_RDX_02;
    break;
  case TEST_TAIL_CALLER:
    kj::heap<capnp::_::TestTailCallerImpl,int&>((kj *)&local_88,*(int **)(in_RSI + 8));
    Capability::Client::Client<capnp::_::TestTailCallerImpl,void>((Client *)this,&local_88);
    kj::Own<capnp::_::TestTailCallerImpl>::~Own(&local_88);
    pCVar2 = extraout_RDX_03;
    break;
  case TEST_MORE_STUFF:
    kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>
              ((kj *)&local_98,*(int **)(in_RSI + 8),*(int **)(in_RSI + 0x10));
    Capability::Client::Client<capnp::_::TestMoreStuffImpl,void>((Client *)this,&local_98);
    kj::Own<capnp::_::TestMoreStuffImpl>::~Own(&local_98);
    pCVar2 = extraout_RDX_04;
    break;
  default:
    kj::_::unreachable();
  }
  CVar3.hook.ptr = pCVar2;
  CVar3.hook.disposer = (Disposer *)this;
  return (Client)CVar3.hook;
}

Assistant:

Capability::Client restore(test::TestSturdyRefObjectId::Reader objectId) override {
    switch (objectId.getTag()) {
      case test::TestSturdyRefObjectId::Tag::TEST_INTERFACE:
        return kj::heap<TestInterfaceImpl>(callCount);
      case test::TestSturdyRefObjectId::Tag::TEST_EXTENDS:
        return Capability::Client(newBrokenCap("No TestExtends implemented."));
      case test::TestSturdyRefObjectId::Tag::TEST_PIPELINE:
        return kj::heap<TestPipelineImpl>(callCount);
      case test::TestSturdyRefObjectId::Tag::TEST_TAIL_CALLEE:
        return kj::heap<TestTailCalleeImpl>(callCount);
      case test::TestSturdyRefObjectId::Tag::TEST_TAIL_CALLER:
        return kj::heap<TestTailCallerImpl>(callCount);
      case test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF:
        return kj::heap<TestMoreStuffImpl>(callCount, handleCount);
    }
    KJ_UNREACHABLE;
  }